

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::rowsInserted
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  QObject *obj;
  ulong uVar1;
  int in_ECX;
  int in_EDX;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = (QObject *)q_func(in_RDI);
  uVar1 = QAccessible::isActive();
  if ((uVar1 & 1) != 0) {
    memset(local_38,0xaa,0x30);
    QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)CONCAT44(in_EDX,in_ECX),obj,
               (ModelChangeType)((ulong)in_RDI >> 0x20));
    QAccessibleTableModelChangeEvent::setFirstRow(local_38,in_EDX);
    QAccessibleTableModelChangeEvent::setLastRow(local_38,in_ECX);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
  }
  updateGeometry(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::rowsInserted(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

#if QT_CONFIG(accessibility)
    Q_Q(QAbstractItemView);
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::RowsInserted);
        accessibleEvent.setFirstRow(start);
        accessibleEvent.setLastRow(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}